

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

void __thiscall YAML::BadFile::BadFile(BadFile *this,string *filename)

{
  allocator local_89;
  Mark local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_88.pos = -1;
  local_88.line = -1;
  local_88.column = -1;
  std::__cxx11::string::string((string *)&local_38,"bad file",&local_89);
  std::operator+(&local_78,&local_38,": ");
  std::operator+(&local_58,&local_78,filename);
  Exception::Exception(&this->super_Exception,&local_88,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__BadConversion_00827c28;
  return;
}

Assistant:

BadFile(const BadFile&) = default;